

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::ClampSpeed(ChBody *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if ((this->bflags & 0x100) != 0) {
    dVar1 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
    dVar2 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
    dVar9 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
    dVar3 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
    auVar5._0_8_ = dVar1 * dVar1;
    auVar5._8_8_ = dVar2 * dVar2;
    auVar5 = vshufpd_avx(auVar5,auVar5,1);
    auVar5 = vfmadd213sd_fma(auVar10,auVar10,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
    auVar5 = vfmadd231sd_fma(auVar5,auVar11,auVar11);
    auVar5 = vfmadd213sd_fma(auVar6,auVar6,auVar5);
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar4 = auVar5._0_8_ + auVar5._0_8_;
    if ((double)this->max_wvel < dVar4) {
      dVar4 = (double)this->max_wvel / dVar4;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0] = dVar1 * dVar4;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1] = dVar2 * dVar4;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2] = dVar9 * dVar4;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3] = dVar3 * dVar4;
    }
    auVar5 = *(undefined1 (*) [16])
              (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data;
    dVar1 = auVar5._0_8_;
    auVar7._0_8_ = dVar1 * dVar1;
    dVar2 = auVar5._8_8_;
    auVar7._8_8_ = dVar2 * dVar2;
    auVar6 = vshufpd_avx(auVar7,auVar7,1);
    dVar4 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar4;
    auVar5 = vfmadd231sd_fma(auVar6,auVar5,auVar5);
    auVar5 = vfmadd231sd_fma(auVar5,auVar8,auVar8);
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    if ((double)this->max_speed < auVar5._0_8_) {
      dVar9 = (double)this->max_speed / auVar5._0_8_;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0] = dVar1 * dVar9;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1] = dVar2 * dVar9;
      (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2] = dVar4 * dVar9;
    }
  }
  return;
}

Assistant:

bool ChBody::BFlagGet(BodyFlag mask) const {
    return (bflags & mask) != 0;
}